

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

void __thiscall
OpenMesh::PolyConnectivity::adjust_outgoing_halfedge(PolyConnectivity *this,VertexHandle _vh)

{
  BaseHandle BVar1;
  Vertex *pVVar2;
  Halfedge *pHVar3;
  bool bVar4;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter vh_it;
  
  pVVar2 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pVVar2->halfedge_handle_).super_BaseHandle.idx_;
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  bVar4 = vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ == -1;
  if (!bVar4) {
    local_38 = (undefined1  [8])this;
    vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
    do {
      if ((vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return;
      }
      if (bVar4) {
LAB_0018f942:
        __assert_fail("this->heh_.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/CirculatorsT.hh"
                      ,0x115,
                      "value_type OpenMesh::Iterators::GenericCirculatorT<OpenMesh::PolyConnectivity, OpenMesh::VertexHandle, OpenMesh::HalfedgeHandle, &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>::operator*() const [Mesh = OpenMesh::PolyConnectivity, CenterEntityHandle = OpenMesh::VertexHandle, ValueHandle = OpenMesh::HalfedgeHandle, Handle2Value = &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle]"
                     );
      }
      pHVar3 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      BVar1.idx_ = vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
      if ((pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) {
        if (vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1) {
          pVVar2 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
          (pVVar2->halfedge_handle_).super_BaseHandle.idx_ = BVar1.idx_;
          return;
        }
        goto LAB_0018f942;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_38);
      bVar4 = vh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1;
    } while (!bVar4);
  }
  return;
}

Assistant:

void PolyConnectivity::adjust_outgoing_halfedge(VertexHandle _vh)
{
  for (ConstVertexOHalfedgeIter vh_it=cvoh_iter(_vh); vh_it.is_valid(); ++vh_it)
  {
    if (is_boundary(*vh_it))
    {
      set_halfedge_handle(_vh, *vh_it);
      break;
    }
  }
}